

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

VRMatrix4 * MinVR::VRMatrix4::rotationY(VRMatrix4 *__return_storage_ptr__,float radians)

{
  float fVar1;
  float local_48 [3];
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined4 local_2c;
  float local_28;
  undefined4 local_24;
  float local_20;
  undefined8 local_1c;
  undefined8 uStack_14;
  undefined4 local_c;
  
  fVar1 = cosf(radians);
  local_28 = sinf(radians);
  local_48[1] = 0.0;
  local_24 = 0;
  local_48[2] = -local_28;
  local_3c = 0;
  uStack_34 = 0x3f800000;
  local_2c = 0;
  local_1c = 0;
  uStack_14 = 0;
  local_c = 0x3f800000;
  local_48[0] = fVar1;
  local_20 = fVar1;
  VRMatrix4(__return_storage_ptr__,local_48);
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 VRMatrix4::rotationY(const float radians) {
  const float cosTheta = cos(radians); 
  const float sinTheta = sin(radians);  
  return VRMatrix4::fromRowMajorElements(cosTheta, 0, sinTheta, 0,
                                         0, 1, 0, 0,
                                         -sinTheta, 0, cosTheta, 0,
                                         0, 0, 0, 1);
}